

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

void __thiscall QTest::TestMethods::invokeTestOnData(TestMethods *this,int index)

{
  long lVar1;
  double dVar2;
  QBenchmarkTestMethodData *pQVar3;
  qsizetype qVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  const_reference pvVar9;
  iterator iVar10;
  iterator iVar11;
  ulong uVar12;
  QBenchmarkResult *in_RCX;
  char *pcVar13;
  QBenchmarkResult *pQVar14;
  iterator __i;
  QList<QBenchmarkResult> *pQVar15;
  int iVar16;
  byte bVar17;
  long in_FS_OFFSET;
  QMetaMethod m;
  QMetaMethod m_00;
  QMetaMethod m_01;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<QBenchmarkResult> local_a8;
  QLatin1String local_88;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_78;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[7])();
  iVar16 = -(uVar7 & 0xff);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QList<QBenchmarkResult> *)0x0;
  bVar17 = 0;
  do {
    QBenchmarkTestMethodData::beginDataRun(QBenchmarkTestMethodData::current);
    if (iVar16 < 0) {
      QBenchmarkTestMethodData::current->iterationCount = 1;
    }
    while( true ) {
      inTestFunction = 1;
      m.data.d = currentTestObject.d;
      m.mobj = (QMetaObject *)(this->m_initMethod).data.d;
      invokeTestMethodIfValid((QTest *)(this->m_initMethod).mobj,m,(QObject *)in_RCX);
      bVar5 = QTestResult::skipCurrentTest();
      bVar6 = true;
      if ((bVar5) || (bVar5 = QTestResult::currentTestFailed(), bVar5)) {
        bVar5 = false;
      }
      else {
        QList<QBenchmarkResult>::clear(&QBenchmarkTestMethodData::current->results);
        pQVar3 = QBenchmarkTestMethodData::current;
        pQVar3->valid = false;
        pQVar3->resultAccepted = false;
        in_RCX = (QBenchmarkResult *)QTestResult::currentDataTag();
        pcVar13 = "";
        if (in_RCX != (QBenchmarkResult *)0x0) {
          pcVar13 = QTestResult::currentDataTag();
        }
        QLatin1String::QLatin1String(&local_88,pcVar13);
        QString::operator=(&(QBenchmarkGlobalData::current->context).tag,
                           (QLatin1String *)local_88.m_size);
        pvVar9 = std::vector<QMetaMethod,_std::allocator<QMetaMethod>_>::operator[]
                           (&this->m_methods,(long)index);
        m_00.data.d = currentTestObject.d;
        m_00.mobj = (QMetaObject *)(pvVar9->data).d;
        bVar5 = invokeTestMethodIfValid((QTest *)pvVar9->mobj,m_00,(QObject *)in_RCX);
        if (!bVar5) {
          QTestResult::addFailure
                    ("Unable to execute slot",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestcase.cpp"
                     ,0x41c);
        }
        bVar17 = QBenchmarkTestMethodData::current->valid;
        bVar6 = false;
      }
      inTestFunction = 0;
      QTestResult::finishedCurrentTestData();
      if ((!bVar6) &&
         (m_01.data.d = currentTestObject.d,
         m_01.mobj = (QMetaObject *)(this->m_cleanupMethod).data.d,
         invokeTestMethodIfValid((QTest *)(this->m_cleanupMethod).mobj,m_01,(QObject *)in_RCX),
         QCoreApplication::self != 0)) {
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      }
      if ((bVar17 & 1) == 0) break;
      if ((((bVar5 == false) || (QBenchmarkTestMethodData::current->resultAccepted != false)) ||
          (bVar6 = QTestResult::skipCurrentTest(), bVar6)) ||
         (bVar6 = QTestResult::currentTestFailed(), bVar6)) goto LAB_00129736;
    }
    QTestResult::finishedCurrentTestDataCleanup();
LAB_00129736:
    QBenchmarkTestMethodData::endDataRun(QBenchmarkTestMethodData::current);
    bVar6 = QTestResult::skipCurrentTest();
    if ((!bVar6) && (bVar6 = QTestResult::currentTestFailed(), !bVar6)) {
      if (-1 < iVar16) {
        QList<QList<QBenchmarkResult>>::emplaceBack<QList<QBenchmarkResult>const&>
                  ((QList<QList<QBenchmarkResult>> *)&local_78,
                   &QBenchmarkTestMethodData::current->results);
      }
      if ((((bVar17 & 1) != 0) && (QBenchmarkGlobalData::current->verboseOutput == true)) &&
         ((QBenchmarkTestMethodData::current->results).d.size != 0)) {
        pQVar14 = (QBenchmarkTestMethodData::current->results).d.ptr;
        pcVar13 = "accumulation stage result: %1";
        if (iVar16 < 0) {
          pcVar13 = "warmup stage result      : %1";
        }
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (QList<QBenchmarkResult> *)&DAT_aaaaaaaaaaaaaaaa;
        latin1.m_data = pcVar13;
        latin1.m_size = 0x1d;
        QString::QString((QString *)&local_58,latin1);
        in_RCX = (QBenchmarkResult *)0x67;
        QString::arg_impl((pQVar14->measurement).value,(int)&local_c0,(char)&local_58,0,(QChar)0x67)
        ;
        QString::toLocal8Bit((QByteArray *)&local_a8,(QString *)&local_c0);
        pQVar14 = local_a8.ptr;
        if (local_a8.ptr == (QBenchmarkResult *)0x0) {
          pQVar14 = (QBenchmarkResult *)&QByteArray::_empty;
        }
        QTestLog::info((char *)pQVar14,(char *)0x0,0);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
    }
    if (QBenchmarkGlobalData::current->minimumTotal == -1) {
      bVar6 = false;
    }
    else {
      iVar10 = QList<QList<QBenchmarkResult>_>::begin((QList<QList<QBenchmarkResult>_> *)&local_78);
      iVar11 = QList<QList<QBenchmarkResult>_>::end((QList<QList<QBenchmarkResult>_> *)&local_78);
      dVar2 = 0.0;
      for (; iVar10.i != iVar11.i; iVar10.i = iVar10.i + 1) {
        if (((iVar10.i)->d).size != 0) {
          in_RCX = ((iVar10.i)->d).ptr;
          dVar2 = dVar2 + (in_RCX->measurement).value;
        }
      }
      bVar6 = dVar2 < (double)QBenchmarkGlobalData::current->minimumTotal;
    }
    if ((bVar17 & 1) == 0) goto LAB_00129a79;
    iVar8 = QBenchmarkGlobalData::adjustMedianIterationCount(QBenchmarkGlobalData::current);
    iVar16 = iVar16 + 1;
  } while (((iVar16 < iVar8 || bVar6) && (bVar6 = QTestResult::skipCurrentTest(), !bVar6)) &&
          (bVar6 = QTestResult::currentTestFailed(), !bVar6));
  bVar6 = QTestResult::skipCurrentTest();
  if (bVar6) {
    bVar6 = false;
  }
  else {
    bVar6 = QTestResult::currentTestFailed();
    bVar6 = !bVar6;
  }
  QTestResult::finishedCurrentTestDataCleanup();
  qVar4 = local_78.size;
  if ((bVar6) && (QBenchmarkTestMethodData::current->resultAccepted == true)) {
    iVar16 = (int)local_78.size;
    if (iVar16 == 1) {
      local_a8.d = ((local_78.ptr)->d).d;
      local_a8.ptr = ((local_78.ptr)->d).ptr;
      local_a8.size = ((local_78.ptr)->d).size;
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else if (iVar16 == 0) {
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (QBenchmarkResult *)0x0;
      local_a8.size = 0;
    }
    else {
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_58.size = local_78.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar10 = QList<QList<QBenchmarkResult>_>::begin((QList<QList<QBenchmarkResult>_> *)&local_58);
      iVar11 = QList<QList<QBenchmarkResult>_>::end((QList<QList<QBenchmarkResult>_> *)&local_58);
      if (iVar10.i != iVar11.i) {
        uVar12 = ((long)iVar11.i - (long)iVar10.i) / 0x18;
        lVar1 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QList<QBenchmarkResult>>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                  (iVar10.i,iVar11.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)iVar11.i - (long)iVar10.i < 0x181) {
          std::
          __insertion_sort<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                    (iVar10.i,iVar11.i);
        }
        else {
          pQVar15 = iVar10.i + 0x10;
          std::
          __insertion_sort<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                    (iVar10.i,pQVar15);
          for (; pQVar15 != iVar11.i; pQVar15 = pQVar15 + 1) {
            std::
            __unguarded_linear_insert<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                      (pQVar15);
          }
        }
      }
      iVar16 = (int)((long)((ulong)(uint)(iVar16 >> 0x1f) << 0x20 | qVar4 & 0xffffffffU) / 2);
      local_a8.d = local_58.ptr[iVar16].d.d;
      local_a8.ptr = local_58.ptr[iVar16].d.ptr;
      local_a8.size = local_58.ptr[iVar16].d.size;
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_58);
    }
    QTestLog::addBenchmarkResults((QList<QBenchmarkResult> *)&local_a8);
    QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer(&local_a8);
  }
LAB_00129a79:
  QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestMethods::invokeTestOnData(int index) const
{
    /* Benchmarking: for each median iteration*/

    bool isBenchmark = false;
    int i = (QBenchmarkGlobalData::current->measurer->needsWarmupIteration()) ? -1 : 0;

    QList<QList<QBenchmarkResult>> resultsList;
    bool minimumTotalReached = false;
    do {
        QBenchmarkTestMethodData::current->beginDataRun();
        if (i < 0)
            QBenchmarkTestMethodData::current->iterationCount = 1;

        /* Benchmarking: for each accumulation iteration*/
        bool invokeOk;
        do {
            QTest::inTestFunction = true;
            invokeTestMethodIfValid(m_initMethod);

            const bool initQuit =
                QTestResult::skipCurrentTest() || QTestResult::currentTestFailed();
            if (!initQuit) {
                QBenchmarkTestMethodData::current->results.clear();
                QBenchmarkTestMethodData::current->resultAccepted = false;
                QBenchmarkTestMethodData::current->valid = false;

                QBenchmarkGlobalData::current->context.tag = QLatin1StringView(
                    QTestResult::currentDataTag() ? QTestResult::currentDataTag() : "");

                invokeOk = invokeTestMethodIfValid(m_methods[index]);
                if (!invokeOk)
                    QTestResult::addFailure("Unable to execute slot", __FILE__, __LINE__);

                isBenchmark = QBenchmarkTestMethodData::current->isBenchmark();
            } else {
                invokeOk = false;
            }

            QTest::inTestFunction = false;
            QTestResult::finishedCurrentTestData();

            if (!initQuit) {
                invokeTestMethodIfValid(m_cleanupMethod);

                // Process any deleteLater(), used by event-loop-based apps.
                // Fixes memleak reports.
                if (QCoreApplication::instance())
                    QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);
            }
            // If the test isn't a benchmark, finalize the result after
            // cleanup() has finished (or init has lead us to skip the test).
            if (!isBenchmark)
                QTestResult::finishedCurrentTestDataCleanup();

            // If this test method has a benchmark, repeat until all measurements are
            // acceptable.
            // The QBENCHMARK macro increases the number of iterations for each run until
            // this happens.
        } while (invokeOk && isBenchmark
                 && QBenchmarkTestMethodData::current->resultsAccepted() == false
                 && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

        QBenchmarkTestMethodData::current->endDataRun();
        if (!QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed()) {
            if (i > -1)  // iteration -1 is the warmup iteration.
                resultsList.append(QBenchmarkTestMethodData::current->results);

            if (isBenchmark && QBenchmarkGlobalData::current->verboseOutput &&
                    !QBenchmarkTestMethodData::current->results.isEmpty()) {
                // we only print the first result
                const QBenchmarkResult &first = QBenchmarkTestMethodData::current->results.constFirst();
                QString pattern = i < 0 ? "warmup stage result      : %1"_L1
                                        : "accumulation stage result: %1"_L1;
                QTestLog::info(qPrintable(pattern.arg(first.measurement.value)), nullptr, 0);
            }
        }

        // Verify if the minimum total measurement (for the first measurement)
        // was reached, if it was specified:
        if (QBenchmarkGlobalData::current->minimumTotal == -1) {
            minimumTotalReached = true;
        } else {
            auto addResult = [](qreal current, const QList<QBenchmarkResult> &r) {
                if (!r.isEmpty())
                    current += r.first().measurement.value;
                return current;
            };
            const qreal total = std::accumulate(resultsList.begin(), resultsList.end(), 0.0, addResult);
            minimumTotalReached = (total >= QBenchmarkGlobalData::current->minimumTotal);
        }
    } while (isBenchmark
             && ((++i < QBenchmarkGlobalData::current->adjustMedianIterationCount()) || !minimumTotalReached)
             && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

    // If the test is a benchmark, finalize the result after all iterations have finished.
    if (isBenchmark) {
        bool testPassed = !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed();
        QTestResult::finishedCurrentTestDataCleanup();
        // Only report benchmark figures if the test passed
        if (testPassed && QBenchmarkTestMethodData::current->resultsAccepted())
            QTestLog::addBenchmarkResults(qMedian(resultsList));
    }
}